

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O1

void __thiscall
Iir::BandStopTransform::BandStopTransform
          (BandStopTransform *this,double fc,double fw,LayoutBase *digital,LayoutBase *analog)

{
  uint uVar1;
  invalid_argument *this_00;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int pairIndex;
  int pairIndex_00;
  double dVar2;
  double dVar3;
  complex_t c;
  complex_t c_00;
  complex_t c_01;
  complex_t c_02;
  ComplexPair zeros;
  ComplexPair p;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  ComplexPair local_50;
  undefined8 extraout_RDX_00;
  
  this->a2 = 0.0;
  this->b2 = 0.0;
  this->a = 0.0;
  this->b = 0.0;
  this->wc = 0.0;
  this->wc2 = 0.0;
  if (0.5 <= fc) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"The cutoff frequency needs to be below the Nyquist frequency.");
  }
  else {
    if (0.0 <= fc) {
      digital->m_numPoles = 0;
      dVar3 = fc * 6.283185307179586 + fw * 6.283185307179586 * -0.5;
      this->wc2 = dVar3;
      dVar2 = fw * 6.283185307179586 + dVar3;
      this->wc = dVar2;
      if (dVar3 < 1e-08) {
        this->wc2 = 1e-08;
      }
      if (3.141592643589793 < dVar2) {
        this->wc = 3.141592643589793;
      }
      local_68 = fc;
      dVar2 = cos((this->wc + this->wc2) * 0.5);
      dVar3 = cos((this->wc - this->wc2) * 0.5);
      this->a = dVar2 / dVar3;
      dVar2 = tan((this->wc - this->wc2) * 0.5);
      this->b = dVar2;
      this->a2 = this->a * this->a;
      this->b2 = dVar2 * dVar2;
      uVar1 = analog->m_numPoles;
      pairIndex = (int)uVar1 / 2;
      if (1 < (int)uVar1) {
        pairIndex_00 = 0;
        do {
          LayoutBase::getPair(analog,pairIndex_00);
          c._M_value._8_8_ = in_RCX;
          c._M_value._0_8_ = extraout_RDX;
          transform(&local_50,this,c);
          c_00._M_value._8_8_ = in_RCX;
          c_00._M_value._0_8_ = extraout_RDX_00;
          transform((ComplexPair *)&local_88,this,c_00);
          if ((local_78 == local_88) && (!NAN(local_78) && !NAN(local_88))) {
            if ((local_70 == local_80) && (!NAN(local_70) && !NAN(local_80))) {
              local_70 = -local_80;
              local_78 = local_88;
            }
          }
          LayoutBase::addPoleZeroConjugatePairs
                    (digital,(complex_t *)&local_50,(complex_t *)&local_88);
          LayoutBase::addPoleZeroConjugatePairs
                    (digital,&local_50.super_complex_pair_t.second,(complex_t *)&local_78);
          pairIndex_00 = pairIndex_00 + 1;
        } while (pairIndex != pairIndex_00);
      }
      if ((uVar1 & 1) != 0) {
        LayoutBase::getPair(analog,pairIndex);
        c_01._M_value._8_8_ = in_RCX;
        c_01._M_value._0_8_ = extraout_RDX_01;
        transform(&local_50,this,c_01);
        LayoutBase::getPair(analog,pairIndex);
        c_02._M_value._8_8_ = in_RCX;
        c_02._M_value._0_8_ = extraout_RDX_02;
        transform((ComplexPair *)&local_88,this,c_02);
        LayoutBase::add(digital,&local_50,(ComplexPair *)&local_88);
      }
      dVar2 = analog->m_normalGain;
      digital->m_normalW = (double)(-(ulong)(local_68 < 0.25) & 0x400921fb54442d18);
      digital->m_normalGain = dVar2;
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Cutoff frequency is negative.");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BandStopTransform::BandStopTransform (double fc,
                                      double fw,
                                      LayoutBase& digital,
                                      LayoutBase const& analog)
{
	if (!(fc < 0.5)) throw_invalid_argument(cutoffError);
	if (fc < 0.0) throw_invalid_argument(cutoffNeg);

	digital.reset ();
	
	const double ww = 2 * doublePi * fw;
	
	wc2 = 2 * doublePi * fc - (ww / 2);
	wc  = wc2 + ww;
	
	// this is crap
	if (wc2 < 1e-8)
		wc2 = 1e-8;
	if (wc  > doublePi-1e-8)
		wc  = doublePi-1e-8;
	
	a = cos ((wc + wc2) * .5) /
		cos ((wc - wc2) * .5);
	b = tan ((wc - wc2) * .5);
	a2 = a * a;
	b2 = b * b;
	
	const int numPoles = analog.getNumPoles ();
	const int pairs = numPoles / 2;
	for (int i = 0; i < pairs; ++i)
	{
		const PoleZeroPair& pair = analog[i];
		ComplexPair p  = transform (pair.poles.first);
		ComplexPair z  = transform (pair.zeros.first);
		
		// trick to get the conjugate
		if (z.second == z.first)
			z.second = std::conj (z.first);
		
		digital.addPoleZeroConjugatePairs (p.first, z.first);
		digital.addPoleZeroConjugatePairs (p.second, z.second);
	}
	
	if (numPoles & 1)
	{
		ComplexPair poles = transform (analog[pairs].poles.first);
		ComplexPair zeros = transform (analog[pairs].zeros.first);
		
		digital.add (poles, zeros);
	}
	
	if (fc < 0.25)
		digital.setNormal (doublePi, analog.getNormalGain());
	else
		digital.setNormal (0, analog.getNormalGain());
}